

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Matchers::Impl::StdString::EndsWith::match(EndsWith *this,string *expr)

{
  bool bVar1;
  string local_38;
  string *local_18;
  string *expr_local;
  EndsWith *this_local;
  
  local_18 = expr;
  expr_local = (string *)this;
  CasedString::adjustString(&local_38,&this->m_data,expr);
  bVar1 = endsWith(&local_38,&(this->m_data).m_str);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return endsWith( m_data.adjustString( expr ), m_data.m_str );
            }